

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::resetComponentBCs(StateDescriptor *this,int comp,BCRec *bcr,BndryFunc *func)

{
  pointer __p;
  BCRec *pBVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  
  __p = (pointer)Vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                 ::operator[]((Vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                               *)in_RDI,in_stack_ffffffffffffffc8);
  (**(code **)*in_RCX)();
  std::
  unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ::reset((unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
           *)in_RDI,__p);
  pBVar1 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[](in_RDI,(size_type)__p);
  *(undefined8 *)pBVar1->bc = *in_RDX;
  *(undefined8 *)(pBVar1->bc + 2) = in_RDX[1];
  *(undefined8 *)(pBVar1->bc + 4) = in_RDX[2];
  return;
}

Assistant:

void
StateDescriptor::resetComponentBCs (int              comp,
                                    const BCRec&     bcr,
                                    const BndryFunc& func)
{
    BL_ASSERT(comp >= 0 && comp < ncomp);

    bc_func[comp].reset(func.clone());
    bc[comp] = bcr;
}